

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceSpot::IfcLightSourceSpot(IfcLightSourceSpot *this)

{
  IfcLightSourceSpot *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xf0,"IfcLightSourceSpot");
  IfcLightSourcePositional::IfcLightSourcePositional
            (&this->super_IfcLightSourcePositional,&PTR_construction_vtable_24__00f72610);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourceSpot,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourceSpot,_4UL> *)
             &(this->super_IfcLightSourcePositional).field_0xb8,
             &PTR_construction_vtable_24__00f726c0);
  (this->super_IfcLightSourcePositional).super_IfcLightSource.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf72530;
  *(undefined8 *)&this->field_0xf0 = 0xf725f8;
  *(undefined8 *)
   &(this->super_IfcLightSourcePositional).super_IfcLightSource.super_IfcGeometricRepresentationItem
    .super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf72558;
  *(undefined8 *)
   &(this->super_IfcLightSourcePositional).super_IfcLightSource.super_IfcGeometricRepresentationItem
    .super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf72580;
  *(undefined8 *)&(this->super_IfcLightSourcePositional).super_IfcLightSource.field_0x80 = 0xf725a8;
  *(undefined8 *)&(this->super_IfcLightSourcePositional).field_0xb8 = 0xf725d0;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *)
             &(this->super_IfcLightSourcePositional).field_0xc8,(LazyObject *)0x0);
  STEP::Maybe<double>::Maybe(&this->ConcentrationExponent);
  return;
}

Assistant:

IfcLightSourceSpot() : Object("IfcLightSourceSpot") {}